

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

_Bool subpage_accepts(uc_struct_conflict15 *uc,void *opaque,hwaddr addr,uint len,_Bool is_write,
                     MemTxAttrs attrs)

{
  _Bool _Var1;
  subpage_t *subpage;
  
  _Var1 = flatview_access_valid
                    (uc,*(FlatView **)((long)opaque + 0xa0),addr + *(long *)((long)opaque + 0xa8),
                     (ulong)len,is_write,attrs);
  return _Var1;
}

Assistant:

static bool subpage_accepts(struct uc_struct *uc, void *opaque, hwaddr addr,
                            unsigned len, bool is_write,
                            MemTxAttrs attrs)
{
    subpage_t *subpage = opaque;
#if defined(DEBUG_SUBPAGE)
    printf("%s: subpage %p %c len %u addr " TARGET_FMT_plx "\n",
           __func__, subpage, is_write ? 'w' : 'r', len, addr);
#endif

    return flatview_access_valid(uc, subpage->fv, addr + subpage->base,
                                 len, is_write, attrs);
}